

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.hpp
# Opt level: O0

Instruction *
Instruction::createArithmetic
          (Instruction *__return_storage_ptr__,int id,char type,int dest,int src1,int src2)

{
  InstructionType IVar1;
  Instruction *instruction;
  int src2_local;
  int src1_local;
  int dest_local;
  char type_local;
  int id_local;
  
  memset(__return_storage_ptr__,0,0x30);
  __return_storage_ptr__->issued_cycle = -1;
  __return_storage_ptr__->executed_cycle = -1;
  __return_storage_ptr__->written_cycle = -1;
  IVar1 = getType(type);
  __return_storage_ptr__->type = IVar1;
  __return_storage_ptr__->id = id;
  __return_storage_ptr__->dest = dest;
  __return_storage_ptr__->src1 = src1;
  __return_storage_ptr__->src2 = src2;
  return __return_storage_ptr__;
}

Assistant:

static Instruction createArithmetic(int id, char type, int dest, int src1, int src2) {
        Instruction instruction{};
        instruction.type = getType(type);
        instruction.id = id;
        instruction.dest = dest;
        instruction.src1 = src1;
        instruction.src2 = src2;

        return instruction;
    }